

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.h
# Opt level: O3

int __thiscall ArgParser::ArgIterator::count(ArgIterator *this)

{
  char *pcVar1;
  char *pcVar2;
  logic_error *this_00;
  char *pcVar3;
  code *pcVar4;
  undefined *puVar5;
  
  if (this->i == this->argc) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::range_error::range_error((range_error *)this_00,"arg out of range");
    puVar5 = &std::range_error::typeinfo;
    pcVar4 = std::range_error::~range_error;
  }
  else {
    if (this->longmatch != true) {
      pcVar1 = this->p;
      pcVar2 = this->pend;
      pcVar3 = pcVar1 + 1;
      if (pcVar3 != pcVar2) {
        do {
          if (*pcVar3 != pcVar1[1]) {
            this_00 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(this_00,"counted options must all be equal");
            goto LAB_00108bc0;
          }
          pcVar3 = pcVar3 + 1;
        } while (pcVar3 != pcVar2);
      }
      return (int)pcVar2 + ~(uint)pcVar1;
    }
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"can\'t count a --long option");
LAB_00108bc0:
    puVar5 = &std::logic_error::typeinfo;
    pcVar4 = std::logic_error::~logic_error;
  }
  __cxa_throw(this_00,puVar5,pcVar4);
}

Assistant:

int count()
        {
            if (i==argc)
                throw std::range_error("arg out of range");
            if (longmatch)
                throw std::logic_error("can't count a --long option");
            char opt = p[1];
            const char *q = p+1;

            while (q!=pend && *q==opt)
                ++q;

            if (q!=pend)
                throw std::logic_error("counted options must all be equal");

            return pend - p - 1;
        }